

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcommandlinkbutton.cpp
# Opt level: O2

QSize __thiscall QCommandLinkButton::sizeHint(QCommandLinkButton *this)

{
  QCommandLinkButtonPrivate *this_00;
  uint uVar1;
  int iVar2;
  int iVar3;
  QSize QVar4;
  ulong uVar5;
  uint uVar6;
  long in_FS_OFFSET;
  QFontMetrics fm;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QCommandLinkButtonPrivate **)(this + 8);
  QVar4 = QPushButton::sizeHint((QPushButton *)this);
  _fm = &DAT_aaaaaaaaaaaaaaaa;
  QCommandLinkButtonPrivate::titleFont((QCommandLinkButtonPrivate *)&stack0xffffffffffffffb0);
  QFontMetrics::QFontMetrics(&fm,(QFont *)&stack0xffffffffffffffb0);
  QFont::~QFont((QFont *)&stack0xffffffffffffffb0);
  QAbstractButton::text((QString *)&stack0xffffffffffffffb0,(QAbstractButton *)this);
  iVar2 = QFontMetrics::horizontalAdvance
                    ((QString *)&fm,(int)(QArrayDataPointer<char16_t> *)&stack0xffffffffffffffb0);
  iVar3 = 0x87;
  if (0x87 < iVar2) {
    iVar3 = iVar2;
  }
  QArrayDataPointer<char16_t>::~QArrayDataPointer
            ((QArrayDataPointer<char16_t> *)&stack0xffffffffffffffb0);
  iVar2 = QCommandLinkButtonPrivate::textOffset(this_00);
  uVar6 = iVar3 + iVar2 + 4;
  iVar3 = QCommandLinkButtonPrivate::descriptionOffset(this_00);
  uVar5 = (ulong)QVar4 & 0xffffffff;
  if (QVar4.wd.m_i.m_i < (int)uVar6) {
    uVar5 = (ulong)uVar6;
  }
  uVar1 = 0x3c;
  if ((this_00->description).d.size == 0) {
    uVar1 = 0x29;
  }
  iVar2 = QCommandLinkButtonPrivate::descriptionHeight(this_00,uVar6);
  uVar6 = iVar2 + iVar3 + 10;
  if ((int)uVar1 <= (int)uVar6) {
    uVar1 = uVar6;
  }
  QFontMetrics::~QFontMetrics(&fm);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return (QSize)(uVar5 | (ulong)uVar1 << 0x20);
  }
  __stack_chk_fail();
}

Assistant:

QSize QCommandLinkButton::sizeHint() const
{
//  Standard size hints from UI specs
//  Without note: 135, 41
//  With note: 135, 60
    Q_D(const QCommandLinkButton);

    QSize size = QPushButton::sizeHint();
    QFontMetrics fm(d->titleFont());
    int textWidth = qMax(fm.horizontalAdvance(text()), 135);
    int buttonWidth = textWidth + d->textOffset() + d->rightMargin();
    int heightWithoutDescription = d->descriptionOffset() + d->bottomMargin();

    size.setWidth(qMax(size.width(), buttonWidth));
    size.setHeight(qMax(d->description.isEmpty() ? 41 : 60,
                        heightWithoutDescription + d->descriptionHeight(buttonWidth)));
    return size;
}